

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 __thiscall djb::tab_r::cdfv(tab_r *this,vec2 *u,float_t zi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float_t u_00;
  float_t u_01;
  pointer pvVar4;
  vec2 vVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float_t w3;
  float_t w2;
  float_t w1;
  int i2;
  int k2;
  int k1;
  int j2;
  int j1;
  int i1;
  float local_54;
  float local_50;
  float local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  u_00 = u->x;
  u_01 = u->y;
  fVar10 = acosf(zi);
  spline::uwrap_edge(u_00,0x40,&local_34,&local_48,&local_4c);
  spline::uwrap_edge(u_01,0x100,&local_38,&local_3c,&local_50);
  spline::uwrap_edge(fVar10 * 0.63661975 * fVar10 * 0.63661975,0x10,&local_40,&local_44,&local_54);
  iVar9 = local_40 * 0x4000 + local_38 * 0x40;
  iVar1 = iVar9 + local_34;
  pvVar4 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = iVar9 + local_48;
  iVar8 = local_40 * 0x4000 + local_3c * 0x40;
  iVar2 = iVar8 + local_34;
  iVar8 = iVar8 + local_48;
  iVar6 = local_38 * 0x40 + local_44 * 0x4000;
  iVar3 = iVar6 + local_34;
  iVar6 = iVar6 + local_48;
  iVar7 = local_44 * 0x4000 + local_3c * 0x40;
  local_34 = local_34 + iVar7;
  iVar7 = iVar7 + local_48;
  fVar11 = (pvVar4[iVar9].x - pvVar4[iVar1].x) * local_4c + pvVar4[iVar1].x;
  fVar10 = (pvVar4[iVar9].y - pvVar4[iVar1].y) * local_4c + pvVar4[iVar1].y;
  fVar13 = (pvVar4[iVar6].x - pvVar4[iVar3].x) * local_4c + pvVar4[iVar3].x;
  fVar12 = (pvVar4[iVar6].y - pvVar4[iVar3].y) * local_4c + pvVar4[iVar3].y;
  fVar11 = (((pvVar4[iVar8].x - pvVar4[iVar2].x) * local_4c + pvVar4[iVar2].x) - fVar11) * local_50
           + fVar11;
  fVar10 = (((pvVar4[iVar8].y - pvVar4[iVar2].y) * local_4c + pvVar4[iVar2].y) - fVar10) * local_50
           + fVar10;
  vVar5.y = (((((pvVar4[iVar7].y - pvVar4[local_34].y) * local_4c + pvVar4[local_34].y) - fVar12) *
              local_50 + fVar12) - fVar10) * local_54 + fVar10;
  vVar5.x = (((((pvVar4[iVar7].x - pvVar4[local_34].x) * local_4c + pvVar4[local_34].x) - fVar13) *
              local_50 + fVar13) - fVar11) * local_54 + fVar11;
  return vVar5;
}

Assistant:

vec2 tab_r::cdfv(const vec2 &u, float_t zi) const
{
	int res1 = 64;
	int res2 = 256;
	int res3 = 16;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(zi) * (2 / m_pi()));

	return spline::eval3d(m_cdf, res1, res2, res3,
	                      spline::uwrap_edge, u1,
	                      spline::uwrap_edge, u2,
	                      spline::uwrap_edge, u3);
}